

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::start_checking(torrent *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  session_settings *psVar6;
  element_type *peVar7;
  int *piVar8;
  pointer this_00;
  torrent_info *ptVar9;
  info_hash_t *piVar10;
  file_storage *this_01;
  undefined4 extraout_var;
  bool local_15a;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_e4;
  anon_class_40_2_49d5364b local_e0;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
  local_b8;
  uchar local_91;
  undefined8 local_90;
  undefined8 local_88;
  int local_80;
  uint local_7c;
  undefined1 local_78 [8];
  span<libtorrent::digest32<256L>_> v2_span;
  undefined1 local_60 [8];
  vector<sha256_hash> hashes;
  bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void> flags;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_3c;
  int local_38;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_34;
  int i;
  int local_2c;
  int local_28;
  int min_outstanding;
  int local_14;
  torrent *ptStack_10;
  int num_outstanding;
  torrent *this_local;
  
  ptStack_10 = this;
  psVar6 = settings(this);
  iVar2 = session_settings::get_int(psVar6,0x4066);
  iVar3 = block_size(this);
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  local_14 = torrent_info::piece_length(peVar7);
  local_14 = (iVar2 * iVar3) / local_14;
  local_2c = 1;
  psVar6 = settings(this);
  i = session_settings::get_int(psVar6,0x4065);
  piVar8 = ::std::max<int>(&local_2c,&i);
  local_28 = *piVar8 << 1;
  if (local_14 < local_28) {
    local_14 = local_28;
  }
  iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&this->m_checking_piece);
  iVar3 = strong_typedef::operator_cast_to_int((strong_typedef *)&this->m_num_checked_pieces);
  local_14 = local_14 - (iVar2 - iVar3);
  if (0 < local_14) {
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    local_34.m_val = (int)torrent_info::end_piece(peVar7);
    bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                      (&this->m_checking_piece,&local_34);
    if (bVar1) {
      uVar5 = strong_typedef::operator_cast_to_int((strong_typedef *)&this->m_checking_piece);
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      uVar4 = torrent_info::num_pieces(peVar7);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"start_checking, checking_piece >= num_pieces. %d >= %d",(ulong)uVar5,
                 (ulong)uVar4);
    }
    else {
      for (local_38 = 0; local_38 < local_14; local_38 = local_38 + 1) {
        bVar1 = has_picker(this);
        if (bVar1) {
          while( true ) {
            peVar7 = ::std::
                     __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(this->super_torrent_hot_members).m_torrent_file);
            local_3c.m_val = (int)torrent_info::end_piece(peVar7);
            bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                              (&this->m_checking_piece,&local_3c);
            local_15a = false;
            if (bVar1) {
              this_00 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&(this->super_torrent_hot_members).m_picker);
              local_15a = piece_picker::have_piece
                                    (this_00,(piece_index_t)(this->m_checking_piece).m_val);
            }
            if (local_15a == false) break;
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                      (&this->m_checking_piece);
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                      (&this->m_num_checked_pieces);
          }
        }
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        hashes.
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = torrent_info::end_piece(peVar7);
        bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                          (&this->m_checking_piece,
                           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                           ((long)&hashes.
                                   super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                   .
                                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        if (bVar1) break;
        hashes.
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 8;
        hashes.
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0x10;
        hashes.
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ =
             libtorrent::flags::operator|
                       ((bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)0x8,
                        (bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)0x10);
        ptVar9 = torrent_file(this);
        piVar10 = torrent_info::info_hashes(ptVar9);
        bVar1 = info_hash_t::has_v1(piVar10);
        if (bVar1) {
          hashes.
          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = ' ';
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>::
          operator|=((bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void> *)
                     ((long)&hashes.
                             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                             .
                             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                     (bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)' ');
        }
        container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
        ::container_wrapper((container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                             *)local_60);
        ptVar9 = torrent_file(this);
        piVar10 = torrent_info::info_hashes(ptVar9);
        bVar1 = info_hash_t::has_v2(piVar10);
        if (bVar1) {
          ptVar9 = torrent_file(this);
          this_01 = torrent_info::orig_files(ptVar9);
          v2_span.m_len._4_4_ = (this->m_checking_piece).m_val;
          iVar2 = file_storage::blocks_in_piece2(this_01,v2_span.m_len._4_4_);
          container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
          ::resize<int,void>((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                              *)local_60,iVar2);
        }
        span<libtorrent::digest32<256l>>::
        span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
                  ((span<libtorrent::digest32<256l>> *)local_78,
                   (container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                    *)local_60);
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[4])();
        local_7c = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
        local_80 = (this->m_checking_piece).m_val;
        span<libtorrent::digest32<256l>>::
        span<libtorrent::span<libtorrent::digest32<256l>>,libtorrent::digest32<256l>,void>
                  ((span<libtorrent::digest32<256l>> *)&local_90,
                   (span<libtorrent::digest32<256L>_> *)local_78);
        local_91 = hashes.
                   super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   .
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_;
        ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                  ((enable_shared_from_this<libtorrent::aux::torrent> *)&local_e0);
        container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
        ::container_wrapper(&local_e0.hashes1,
                            (container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                             *)local_60);
        ::std::
        function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>
        ::function<libtorrent::aux::torrent::start_checking()::__0,void>
                  ((function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>
                    *)&local_b8,&local_e0);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
                  ((long *)CONCAT44(extraout_var,iVar2),local_7c,local_80,local_90,local_88,local_91
                   ,&local_b8);
        ::std::
        function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
        ::~function(&local_b8);
        start_checking()::$_0::~__0((__0 *)&local_e0);
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                  (&this->m_checking_piece);
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        local_e4.m_val = (int)torrent_info::end_piece(peVar7);
        bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                          (&this->m_checking_piece,&local_e4);
        container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
        ::~container_wrapper
                  ((container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                    *)local_60);
        if (bVar1) break;
      }
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
      uVar5 = strong_typedef::operator_cast_to_int((strong_typedef *)&this->m_checking_piece);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"start_checking, m_checking_piece: %d",(ulong)uVar5);
    }
  }
  return;
}

Assistant:

void torrent::start_checking() try
	{
		TORRENT_ASSERT(should_check_files());

		int num_outstanding = settings().get_int(settings_pack::checking_mem_usage) * block_size()
			/ m_torrent_file->piece_length();
		// if we only keep a single read operation in-flight at a time, we suffer
		// significant performance degradation. Always keep at least 4 jobs
		// outstanding per hasher thread
		int const min_outstanding
			= std::max(1, settings().get_int(settings_pack::hashing_threads)) * 2;
		if (num_outstanding < min_outstanding) num_outstanding = min_outstanding;

		// subtract the number of pieces we already have outstanding
		num_outstanding -= (static_cast<int>(m_checking_piece)
			- static_cast<int>(m_num_checked_pieces));
		if (num_outstanding <= 0) return;

		// we might already have some outstanding jobs, if we were paused and
		// resumed quickly, before the outstanding jobs completed
		if (m_checking_piece >= m_torrent_file->end_piece())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_checking, checking_piece >= num_pieces. %d >= %d"
				, static_cast<int>(m_checking_piece), m_torrent_file->num_pieces());
#endif
			return;
		}

		for (int i = 0; i < num_outstanding; ++i)
		{
			if (has_picker())
			{
				// skip pieces we already have
				while (m_checking_piece < m_torrent_file->end_piece()
					&& m_picker->have_piece(m_checking_piece))
				{
					++m_checking_piece;
					++m_num_checked_pieces;
				}
			}

			if (m_checking_piece >= m_torrent_file->end_piece()) break;

			auto flags = disk_interface::sequential_access | disk_interface::volatile_read;
			if (torrent_file().info_hashes().has_v1())
				flags |= disk_interface::v1_hash;
			aux::vector<sha256_hash> hashes;
			if (torrent_file().info_hashes().has_v2())
				hashes.resize(torrent_file().orig_files().blocks_in_piece2(m_checking_piece));

			span<sha256_hash> v2_span(hashes);
			m_ses.disk_thread().async_hash(m_storage, m_checking_piece, v2_span, flags
				, [self = shared_from_this(), hashes1 = std::move(hashes)]
				(piece_index_t p, sha1_hash const& h, storage_error const& error) mutable
				{ self->on_piece_hashed(std::move(hashes1), p, h, error); });
			++m_checking_piece;
			if (m_checking_piece >= m_torrent_file->end_piece()) break;
		}
		m_ses.deferred_submit_jobs();
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("start_checking, m_checking_piece: %d"
			, static_cast<int>(m_checking_piece));
#endif
	}
	catch (...) { handle_exception(); }